

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

void __thiscall
cxxopts::option_not_present_exception::option_not_present_exception
          (option_not_present_exception *this,string *option)

{
  long *plVar1;
  long *plVar2;
  size_type *psVar3;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,"Option ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::LQUOTE_abi_cxx11_);
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_40,(ulong)(option->_M_dataplus)._M_p);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_90 = *plVar2;
    lStack_88 = plVar1[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar2;
    local_a0 = (long *)*plVar1;
  }
  local_98 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_a0,(anonymous_namespace)::RQUOTE_abi_cxx11_);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_70 = *plVar2;
    lStack_68 = plVar1[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar2;
    local_80 = (long *)*plVar1;
  }
  local_78 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_80);
  psVar3 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_60.field_2._M_allocated_capacity = *psVar3;
    local_60.field_2._8_8_ = plVar1[3];
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar3;
    local_60._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_60._M_string_length = plVar1[1];
  *plVar1 = (long)psVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  OptionException::OptionException((OptionException *)this,&local_60);
  *(undefined ***)&(this->super_OptionParseException).super_OptionException =
       &PTR__OptionException_001a63c8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&(this->super_OptionParseException).super_OptionException =
       &PTR__OptionException_001a64c8;
  return;
}

Assistant:

option_not_present_exception(const std::string& option)
    : OptionParseException("Option " + LQUOTE + option + RQUOTE + " not present")
    {
    }